

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

void __thiscall
FIX::double_conversion::Single::NormalizedBoundaries
          (Single *this,DiyFp *out_m_minus,DiyFp *out_m_plus)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  float fVar5;
  DiyFp DVar6;
  DiyFp local_a0;
  DiyFp local_90;
  undefined1 local_80 [8];
  DiyFp m_minus;
  DiyFp local_60;
  undefined1 local_50 [8];
  DiyFp m_plus;
  undefined1 local_30 [8];
  DiyFp v;
  DiyFp *out_m_plus_local;
  DiyFp *out_m_minus_local;
  Single *this_local;
  
  v._8_8_ = out_m_plus;
  fVar5 = value(this);
  if (0.0 < fVar5) {
    DVar6 = AsDiyFp(this);
    m_plus._8_8_ = DVar6.f_;
    v.f_._0_4_ = DVar6.e_;
    local_30 = (undefined1  [8])m_plus._8_8_;
    uVar4 = DiyFp::f((DiyFp *)local_30);
    iVar2 = DiyFp::e((DiyFp *)local_30);
    DiyFp::DiyFp(&local_60,uVar4 * 2 + 1,iVar2 + -1);
    DVar6 = DiyFp::Normalize(&local_60);
    m_minus._8_8_ = DVar6.f_;
    m_plus.f_._0_4_ = DVar6.e_;
    local_50 = (undefined1  [8])m_minus._8_8_;
    DiyFp::DiyFp((DiyFp *)local_80);
    bVar1 = LowerBoundaryIsCloser(this);
    if (bVar1) {
      uVar4 = DiyFp::f((DiyFp *)local_30);
      iVar2 = DiyFp::e((DiyFp *)local_30);
      DiyFp::DiyFp(&local_90,uVar4 * 4 - 1,iVar2 + -2);
      local_80 = (undefined1  [8])local_90.f_;
      m_minus.f_._0_4_ = local_90.e_;
    }
    else {
      uVar4 = DiyFp::f((DiyFp *)local_30);
      iVar2 = DiyFp::e((DiyFp *)local_30);
      DiyFp::DiyFp(&local_a0,uVar4 * 2 - 1,iVar2 + -1);
      local_80 = (undefined1  [8])local_a0.f_;
      m_minus.f_._0_4_ = local_a0.e_;
    }
    uVar4 = DiyFp::f((DiyFp *)local_80);
    iVar2 = DiyFp::e((DiyFp *)local_80);
    iVar3 = DiyFp::e((DiyFp *)local_50);
    DiyFp::set_f((DiyFp *)local_80,uVar4 << ((char)iVar2 - (char)iVar3 & 0x3fU));
    iVar2 = DiyFp::e((DiyFp *)local_50);
    DiyFp::set_e((DiyFp *)local_80,iVar2);
    *(undefined1 (*) [8])v._8_8_ = local_50;
    *(int *)(v._8_8_ + 8) = (int)m_plus.f_;
    out_m_minus->f_ = (uint64_t)local_80;
    out_m_minus->e_ = (int)m_minus.f_;
    return;
  }
  __assert_fail("value() > 0.0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/ieee.h"
                ,0x157,
                "void FIX::double_conversion::Single::NormalizedBoundaries(DiyFp *, DiyFp *) const")
  ;
}

Assistant:

void NormalizedBoundaries(DiyFp* out_m_minus, DiyFp* out_m_plus) const {
    ASSERT(value() > 0.0);
    DiyFp v = this->AsDiyFp();
    DiyFp m_plus = DiyFp::Normalize(DiyFp((v.f() << 1) + 1, v.e() - 1));
    DiyFp m_minus;
    if (LowerBoundaryIsCloser()) {
      m_minus = DiyFp((v.f() << 2) - 1, v.e() - 2);
    } else {
      m_minus = DiyFp((v.f() << 1) - 1, v.e() - 1);
    }
    m_minus.set_f(m_minus.f() << (m_minus.e() - m_plus.e()));
    m_minus.set_e(m_plus.e());
    *out_m_plus = m_plus;
    *out_m_minus = m_minus;
  }